

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O0

bool __thiscall
Js::InterpreterStackFrame::
TrySetPropertyLocalFastPath<Js::OpLayoutT_ElementRootCP<Js::LayoutSizePolicy<(Js::LayoutSize)0>>const__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutT_ElementRootCP<Js::LayoutSizePolicy<(Js::LayoutSize)0>_> *playout,PropertyId pid,
          RecyclableObject *instance,InlineCache **inlineCache,PropertyOperationFlags flags)

{
  bool bVar1;
  uint uVar2;
  InlineCache *pIVar3;
  FunctionBody *functionBody;
  Var propertyValue;
  ScriptContext *requestContext;
  undefined1 local_78 [8];
  PropertyValueInfo info;
  PropertyOperationFlags flags_local;
  InlineCache **inlineCache_local;
  RecyclableObject *instance_local;
  PropertyId pid_local;
  OpLayoutT_ElementRootCP<Js::LayoutSizePolicy<(Js::LayoutSize)0>_> *playout_local;
  InterpreterStackFrame *this_local;
  
  info._60_4_ = flags;
  pIVar3 = GetInlineCache(this,playout->inlineCacheIndex);
  *inlineCache = pIVar3;
  PropertyValueInfo::PropertyValueInfo((PropertyValueInfo *)local_78);
  functionBody = GetFunctionBody(this);
  PropertyValueInfo::SetCacheInfo
            ((PropertyValueInfo *)local_78,functionBody,*inlineCache,playout->inlineCacheIndex,true)
  ;
  uVar2 = info._60_4_ & 2;
  propertyValue = GetReg<unsigned_char>(this,playout->Value);
  requestContext = GetScriptContext(this);
  bVar1 = CacheOperators::TrySetProperty<true,false,false,false,false,true,false,false>
                    (instance,uVar2 != 0,pid,propertyValue,requestContext,info._60_4_,
                     (PropertyCacheOperationInfo *)0x0,(PropertyValueInfo *)local_78);
  return bVar1;
}

Assistant:

inline bool InterpreterStackFrame::TrySetPropertyLocalFastPath(unaligned T* playout, PropertyId pid, RecyclableObject* instance, InlineCache*& inlineCache, PropertyOperationFlags flags)
    {
        inlineCache = this->GetInlineCache(playout->inlineCacheIndex);

        PropertyValueInfo info;
        PropertyValueInfo::SetCacheInfo(&info, GetFunctionBody(), inlineCache, playout->inlineCacheIndex, true);
        return
            CacheOperators::TrySetProperty<true, false, false, false, false, true, false, false>(
                instance,
                !!(flags & PropertyOperation_Root),
                pid,
                GetReg(playout->Value),
                GetScriptContext(),
                flags,
                nullptr,
                &info);
    }